

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O2

Pointer<anurbs::BrepTrim> __thiscall
anurbs::Ref<anurbs::BrepTrim>::data(Ref<anurbs::BrepTrim> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  Pointer<anurbs::BrepTrim> PVar1;
  
  std::__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> *)(*in_RSI + 0x28));
  PVar1.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Pointer<anurbs::BrepTrim>)
         PVar1.super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<TData> data() const
    {
        return m_entry->data();
    }